

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_test_tests.cpp
# Opt level: O2

void __thiscall
test::iu_TypedTest3_x_iutest_x_Mul2_Test<float>::Body
          (iu_TypedTest3_x_iutest_x_Mul2_Test<float> *this)

{
  float *in_R9;
  TypeParam_conflict9 x;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  x = 1.0;
  local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = 0x40000000;
  iutest::internal::CmpHelperLT<float,float>
            (&iutest_ar,(internal *)0x326e88,"2*x",(char *)&x,(float *)&local_190,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/typed_test_tests.cpp"
               ,0x4b,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST_TYPED_TEST(TypedTest3, Mul2)
{
    TypeParam x = 1;
    IUTEST_ASSERT_LT(x, 2*x);
}